

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::adv_thread_pool::anon_unknown_6::proxy_dispatcher_t::~proxy_dispatcher_t
          (proxy_dispatcher_t *this)

{
  queue_params_t *pqVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *peVar4;
  
  (this->super_proxy_dispatcher_base_t).
  super_ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>.super_dispatcher_t.
  _vptr_dispatcher_t = (_func_int **)&PTR__proxy_dispatcher_template_t_0028e2b8;
  pcVar2 = (this->super_proxy_dispatcher_base_t).m_data_source_base_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_proxy_dispatcher_base_t).m_data_source_base_name.field_2) {
    operator_delete(pcVar2);
  }
  p_Var3 = (this->super_proxy_dispatcher_base_t).m_disp_params.m_queue_params.m_lock_factory.
           super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pqVar1 = &(this->super_proxy_dispatcher_base_t).m_disp_params.m_queue_params;
    (*p_Var3)((_Any_data *)pqVar1,(_Any_data *)pqVar1,__destroy_functor);
  }
  peVar4 = (this->super_proxy_dispatcher_base_t).m_disp._M_t.
           super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
           .
           super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_false>
           ._M_head_impl;
  if (peVar4 != (ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *)0x0) {
    (*(peVar4->super_dispatcher_t)._vptr_dispatcher_t[1])();
  }
  (this->super_proxy_dispatcher_base_t).m_disp._M_t.
  super___uniq_ptr_impl<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_std::default_delete<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_>_>
  .
  super__Head_base<0UL,_so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t>_*,_false>
  ._M_head_impl = (ext_dispatcher_iface_t<so_5::disp::adv_thread_pool::bind_params_t> *)0x0;
  so_5::dispatcher_t::~dispatcher_t((dispatcher_t *)this);
  operator_delete(this);
  return;
}

Assistant:

proxy_dispatcher_t( disp_params_t params )
			:	proxy_dispatcher_base_t( std::move(params) )
			{}